

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsitem.cpp
# Opt level: O2

void __thiscall QGraphicsItemGroup::addToGroup(QGraphicsItemGroup *this,QGraphicsItem *item)

{
  double dVar1;
  qreal qVar2;
  long lVar3;
  QGraphicsItemPrivate *pQVar4;
  QGraphicsItemPrivate *pQVar5;
  TransformData *pTVar6;
  long lVar7;
  qreal *pqVar8;
  QTransform *pQVar9;
  float *pfVar10;
  char *pcVar11;
  qreal *pqVar12;
  QTransform *pQVar13;
  QMatrix4x4 *pQVar14;
  int i;
  undefined1 *puVar15;
  long in_FS_OFFSET;
  byte bVar16;
  undefined4 uVar17;
  undefined4 uVar18;
  double dVar19;
  QPointF QVar20;
  QRectF local_228;
  undefined1 local_208 [32];
  QArrayDataPointer<QGraphicsTransform_*> local_1e8;
  bool ok;
  QRectF local_1c0 [2];
  QMatrix4x4 m;
  QTransform local_128;
  QTransform local_d0;
  QTransform itemTransform;
  
  bVar16 = 0;
  lVar3 = *(long *)(in_FS_OFFSET + 0x28);
  if (item == (QGraphicsItem *)0x0) {
    pQVar9 = &itemTransform;
    itemTransform.m_matrix[0][0]._0_4_ = 2;
    itemTransform.m_matrix[0][2]._4_4_ = 0;
    itemTransform.m_matrix[0]._4_8_ = 0;
    itemTransform.m_matrix[0]._12_8_ = 0;
    itemTransform.m_matrix[1][0] = (qreal)anon_var_dwarf_66827;
    pcVar11 = "QGraphicsItemGroup::addToGroup: cannot add null item";
  }
  else if (item == &this->super_QGraphicsItem) {
    pQVar9 = &itemTransform;
    itemTransform.m_matrix[0][0]._0_4_ = 2;
    itemTransform.m_matrix[0][2]._4_4_ = 0;
    itemTransform.m_matrix[0]._4_8_ = 0;
    itemTransform.m_matrix[0]._12_8_ = 0;
    itemTransform.m_matrix[1][0] = (qreal)anon_var_dwarf_66827;
    pcVar11 = "QGraphicsItemGroup::addToGroup: cannot add a group to itself";
  }
  else {
    pQVar4 = (this->super_QGraphicsItem).d_ptr.d;
    ok = true;
    pqVar8 = (qreal *)&DAT_00677848;
    pqVar12 = (qreal *)&itemTransform;
    for (lVar7 = 10; lVar7 != 0; lVar7 = lVar7 + -1) {
      *pqVar12 = *pqVar8;
      pqVar8 = pqVar8 + 1;
      pqVar12 = pqVar12 + 1;
    }
    QGraphicsItem::itemTransform(&itemTransform,item,&this->super_QGraphicsItem,&ok);
    if (ok != false) {
      pQVar9 = &itemTransform;
      pQVar13 = &local_d0;
      for (lVar7 = 10; lVar7 != 0; lVar7 = lVar7 + -1) {
        pQVar13->m_matrix[0][0] = pQVar9->m_matrix[0][0];
        pQVar9 = (QTransform *)((long)pQVar9 + ((ulong)bVar16 * -2 + 1) * 8);
        pQVar13 = (QTransform *)((long)pQVar13 + ((ulong)bVar16 * -2 + 1) * 8);
      }
      QVar20 = QGraphicsItem::mapFromItem(&this->super_QGraphicsItem,item,0.0,0.0);
      local_128.m_matrix[0][0] = QVar20.xp;
      local_128.m_matrix[0][1] = QVar20.yp;
      QGraphicsItem::setPos(item,(QPointF *)&local_128);
      QGraphicsItem::setParentItem(item,&this->super_QGraphicsItem);
      pQVar5 = (item->d_ptr).d;
      dVar19 = (pQVar5->pos).xp;
      dVar1 = (pQVar5->pos).yp;
      if ((((dVar19 != 0.0) || (NAN(dVar19))) || (dVar1 != 0.0)) || (NAN(dVar1))) {
        QTransform::fromTranslate
                  ((double)((ulong)dVar19 ^ (ulong)DAT_005e55b0),
                   (double)((ulong)dVar1 ^ (ulong)DAT_005e55b0));
        QTransform::operator*=(&local_d0,&local_128);
      }
      QVar20 = QGraphicsItem::transformOriginPoint(item);
      pfVar10 = (float *)&DAT_00677800;
      pQVar14 = &m;
      for (lVar7 = 0x11; lVar7 != 0; lVar7 = lVar7 + -1) {
        pQVar14->m[0][0] = *pfVar10;
        pfVar10 = pfVar10 + (ulong)bVar16 * -2 + 1;
        pQVar14 = (QMatrix4x4 *)((long)pQVar14 + (ulong)bVar16 * -8 + 4);
      }
      QMatrix4x4::QMatrix4x4(&m);
      local_1e8.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
      local_1e8.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
      local_1e8.ptr = (QGraphicsTransform **)&DAT_aaaaaaaaaaaaaaaa;
      QGraphicsItem::transformations((QList<QGraphicsTransform_*> *)&local_1e8,item);
      for (puVar15 = (undefined1 *)0x0; puVar15 < (ulong)local_1e8.size; puVar15 = puVar15 + 1) {
        (**(code **)(*(long *)local_1e8.ptr[(long)puVar15] + 0x60))(local_1e8.ptr[(long)puVar15],&m)
        ;
      }
      QMatrix4x4::toTransform();
      QTransform::inverted((bool *)&local_128);
      QTransform::operator*=(&local_d0,&local_128);
      QTransform::translate(QVar20.xp,QVar20.yp);
      pTVar6 = ((item->d_ptr).d)->transformData;
      if (pTVar6 == (TransformData *)0x0) {
        uVar17 = 0;
        uVar18 = 0;
      }
      else {
        qVar2 = pTVar6->rotation;
        uVar17 = SUB84(qVar2,0);
        uVar18 = (undefined4)((ulong)qVar2 >> 0x20);
      }
      QTransform::rotate(-(double)CONCAT44(uVar18,uVar17),(Axis)&local_d0);
      pTVar6 = ((item->d_ptr).d)->transformData;
      dVar1 = 1.0;
      dVar19 = 1.0;
      if (pTVar6 != (TransformData *)0x0) {
        dVar19 = pTVar6->scale;
        dVar1 = 1.0 / dVar19;
      }
      QTransform::scale(dVar1,1.0 / dVar19);
      QTransform::translate(-QVar20.xp,-QVar20.yp);
      QGraphicsItem::setTransform(item,&local_d0,false);
      QGraphicsItemPrivate::setIsMemberOfGroup((item->d_ptr).d,true);
      QGraphicsItem::prepareGeometryChange(&this->super_QGraphicsItem);
      (*item->_vptr_QGraphicsItem[3])(local_208,item);
      QGraphicsItem::childrenBoundingRect(&local_228,item);
      QRectF::operator|(local_1c0,(QRectF *)local_208);
      QTransform::mapRect((QRectF *)&local_128);
      QRectF::operator|=((QRectF *)(pQVar4 + 1),(QRectF *)&local_128);
      local_128.m_matrix[0][2] = 0.0;
      local_128.m_matrix[1][0] = 0.0;
      local_128.m_matrix[0][0] = 0.0;
      local_128.m_matrix[0][1] = 0.0;
      QGraphicsItem::update(&this->super_QGraphicsItem,(QRectF *)&local_128);
      QArrayDataPointer<QGraphicsTransform_*>::~QArrayDataPointer(&local_1e8);
      goto LAB_00573439;
    }
    pQVar9 = &local_d0;
    local_d0.m_matrix[0][0]._0_4_ = 2;
    local_d0.m_matrix[0][2]._4_4_ = 0;
    local_d0.m_matrix[0]._4_8_ = 0;
    local_d0.m_matrix[0]._12_8_ = 0;
    local_d0.m_matrix[1][0] = 3.05543930413181e-317;
    pcVar11 = 
    "QGraphicsItemGroup::addToGroup: could not find a valid transformation from item to group coordinates"
    ;
  }
  QMessageLogger::warning((char *)pQVar9,pcVar11);
LAB_00573439:
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar3) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QGraphicsItemGroup::addToGroup(QGraphicsItem *item)
{
    Q_D(QGraphicsItemGroup);
    if (!item) {
        qWarning("QGraphicsItemGroup::addToGroup: cannot add null item");
        return;
    }
    if (item == this) {
        qWarning("QGraphicsItemGroup::addToGroup: cannot add a group to itself");
        return;
    }

    // COMBINE
    bool ok;
    QTransform itemTransform = item->itemTransform(this, &ok);

    if (!ok) {
        qWarning("QGraphicsItemGroup::addToGroup: could not find a valid transformation from item to group coordinates");
        return;
    }

    QTransform newItemTransform(itemTransform);
    item->setPos(mapFromItem(item, 0, 0));
    item->setParentItem(this);

    // removing position from translation component of the new transform
    if (!item->pos().isNull())
        newItemTransform *= QTransform::fromTranslate(-item->x(), -item->y());

    // removing additional transformations properties applied with itemTransform()
    QPointF origin = item->transformOriginPoint();
    QMatrix4x4 m;
    QList<QGraphicsTransform*> transformList = item->transformations();
    for (int i = 0; i < transformList.size(); ++i)
        transformList.at(i)->applyTo(&m);
    newItemTransform *= m.toTransform().inverted();
    newItemTransform.translate(origin.x(), origin.y());
    newItemTransform.rotate(-item->rotation());
    newItemTransform.scale(1/item->scale(), 1/item->scale());
    newItemTransform.translate(-origin.x(), -origin.y());

    // ### Expensive, we could maybe use dirtySceneTransform bit for optimization

    item->setTransform(newItemTransform);
    item->d_func()->setIsMemberOfGroup(true);
    prepareGeometryChange();
    d->itemsBoundingRect |= itemTransform.mapRect(item->boundingRect() | item->childrenBoundingRect());
    update();
}